

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.h
# Opt level: O0

void mSleep(long Milliseconds)

{
  undefined1 local_20 [8];
  timespec req;
  long Milliseconds_local;
  
  local_20 = (undefined1  [8])(Milliseconds / 1000);
  req.tv_sec = (Milliseconds % 1000) * 1000000;
  req.tv_nsec = Milliseconds;
  nanosleep((timespec *)local_20,(timespec *)0x0);
  return;
}

Assistant:

inline void mSleep(long Milliseconds)
{
#ifdef _WIN32
	Sleep(Milliseconds);
#else 
	// usleep() is considered as obsolete.
	//usleep(Milliseconds*1000);
	struct timespec req;

	req.tv_sec = Milliseconds/1000; // Seconds.
	req.tv_nsec = (Milliseconds%1000)*1000000; // Additional nanoseconds.
	nanosleep(&req, NULL);
#endif // _WIN32
}